

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::AuthenticatedStream> * __thiscall
kj::Maybe<kj::AuthenticatedStream>::operator=
          (Maybe<kj::AuthenticatedStream> *this,Maybe<kj::AuthenticatedStream> *other)

{
  PeerIdentity *pPVar1;
  Disposer *pDVar2;
  AsyncIoStream *pAVar3;
  
  if (other != this) {
    if ((this->ptr).isSet == true) {
      (this->ptr).isSet = false;
      pPVar1 = (this->ptr).field_1.value.peerIdentity.ptr;
      if (pPVar1 != (PeerIdentity *)0x0) {
        (this->ptr).field_1.value.peerIdentity.ptr = (PeerIdentity *)0x0;
        pDVar2 = (this->ptr).field_1.value.peerIdentity.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,pPVar1->_vptr_PeerIdentity[-2] + (long)&pPVar1->_vptr_PeerIdentity);
      }
      pAVar3 = (this->ptr).field_1.value.stream.ptr;
      if (pAVar3 != (AsyncIoStream *)0x0) {
        (this->ptr).field_1.value.stream.ptr = (AsyncIoStream *)0x0;
        pDVar2 = (this->ptr).field_1.value.stream.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                          (long)&(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream);
      }
    }
    if ((other->ptr).isSet == true) {
      (this->ptr).field_1.value.stream.disposer = (other->ptr).field_1.value.stream.disposer;
      (this->ptr).field_1.value.stream.ptr = (other->ptr).field_1.value.stream.ptr;
      (other->ptr).field_1.value.stream.ptr = (AsyncIoStream *)0x0;
      (this->ptr).field_1.value.peerIdentity.disposer =
           (other->ptr).field_1.value.peerIdentity.disposer;
      (this->ptr).field_1.value.peerIdentity.ptr = (other->ptr).field_1.value.peerIdentity.ptr;
      (other->ptr).field_1.value.peerIdentity.ptr = (PeerIdentity *)0x0;
      (this->ptr).isSet = true;
    }
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    pPVar1 = (other->ptr).field_1.value.peerIdentity.ptr;
    if (pPVar1 != (PeerIdentity *)0x0) {
      (other->ptr).field_1.value.peerIdentity.ptr = (PeerIdentity *)0x0;
      pDVar2 = (other->ptr).field_1.value.peerIdentity.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,pPVar1->_vptr_PeerIdentity[-2] + (long)&pPVar1->_vptr_PeerIdentity);
    }
    pAVar3 = (other->ptr).field_1.value.stream.ptr;
    if (pAVar3 != (AsyncIoStream *)0x0) {
      (other->ptr).field_1.value.stream.ptr = (AsyncIoStream *)0x0;
      pDVar2 = (other->ptr).field_1.value.stream.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                        (long)&(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream);
    }
  }
  return this;
}

Assistant:

inline Maybe& operator=(Maybe&& other) { ptr = kj::mv(other.ptr); other = kj::none; return *this; }